

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgraphelt3d.cpp
# Opt level: O3

void __thiscall
TPZGraphElT3d::QsiEta(TPZGraphElT3d *this,TPZVec<int> *i,int imax,TPZVec<double> *qsieta)

{
  double *pdVar1;
  double dVar2;
  
  TPZGraphEl::QsiEta((TPZGraphEl *)this,i,imax,qsieta);
  pdVar1 = qsieta->fStore;
  dVar2 = pdVar1[2] + -1.0;
  *pdVar1 = dVar2 * (pdVar1[1] + -1.0) * (*pdVar1 + 1.0) * 0.125;
  pdVar1[1] = dVar2 * -(pdVar1[1] + 1.0) * 0.25;
  pdVar1[2] = (pdVar1[2] + 1.0) * 0.5;
  return;
}

Assistant:

void TPZGraphElT3d::QsiEta(TPZVec<int> &i, int imax, TPZVec<REAL> &qsieta)
{
	TPZGraphElQ3dd::QsiEta(i,imax,qsieta);
	REAL temp[3];
	temp[0] = (-1.+qsieta[1])*(1.+qsieta[0])*(-1.+qsieta[2])/8.;
	temp[1] = -(1.+qsieta[1])*(-1.+qsieta[2])/4.;
	temp[2] = (1.+qsieta[2])/2.;
	qsieta[0] = temp[0];
	qsieta[1] = temp[1];
	qsieta[2] = temp[2];
}